

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallhv(void *handle,char *name,void **args)

{
  int iVar1;
  type_id tVar2;
  void **in_RDX;
  void *in_RSI;
  void *in_RDI;
  function f;
  value f_val;
  char *in_stack_ffffffffffffffd0;
  value v;
  void *in_stack_ffffffffffffffd8;
  void *local_8;
  
  iVar1 = loader_impl_handle_validate(in_RDI);
  if (iVar1 == 0) {
    loader_handle_get(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    v = (value)0x0;
    tVar2 = value_type_id(in_RDX);
    if (tVar2 == 0xd) {
      value_to_function(v);
    }
    local_8 = metacallfv(in_RSI,in_RDX);
  }
  else {
    log_write_impl_va("metacall",0x209,"metacallhv",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Handle %p passed to metacallhv is not valid",in_RDI);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *metacallhv(void *handle, const char *name, void *args[])
{
	if (loader_impl_handle_validate(handle) != 0)
	{
		// TODO: Implement type error return a value
		log_write("metacall", LOG_LEVEL_ERROR, "Handle %p passed to metacallhv is not valid", handle);
		return NULL;
	}

	value f_val = loader_handle_get(handle, name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	return metacallfv(f, args);
}